

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O3

ze_result_t zelTracerSetEnabled(zel_tracer_handle_t hTracer,ze_bool_t enable)

{
  ze_result_t zVar1;
  
  if ((ze_lib::destruction == '\0') && (*(code **)(ze_lib::context + 0x48) != (code *)0x0)) {
    zVar1 = (**(code **)(ze_lib::context + 0x48))(hTracer,enable);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerSetEnabled(
    zel_tracer_handle_t hTracer,                ///< [in] handle of the tracer
    ze_bool_t enable                            ///< [in] enable the tracer if true; disable if false
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnSetEnabled = ze_lib::context->zelTracingDdiTable.Tracer.pfnSetEnabled;
    if( nullptr == pfnSetEnabled )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnSetEnabled( hTracer, enable );
}